

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::add(Matrix *this,Matrix *input)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  if ((input->rows == this->rows) && (input->cols == this->cols)) {
    lVar3 = input->cols * input->rows;
    if (lVar3 != 0) {
      pdVar1 = input->data;
      pdVar2 = this->data;
      lVar4 = 0;
      do {
        pdVar2[lVar4] = pdVar1[lVar4] + pdVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar3 - lVar4 != 0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rows and Cols don\'t match up",0x1c);
    this = (Matrix *)0x0;
  }
  return this;
}

Assistant:

Matrix* Matrix::add(Matrix* input) {
	if (input->rows != rows || input->cols != cols) {
		std::cout << "Rows and Cols don't match up";
		return nullptr;
	}

	for (size_t i = 0; i < rows*cols; i++) {
		data[i] += input->data[i];
	}
	return this;
}